

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonParseFree(JsonParse *pParse)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(uint *)((long)in_RDI + 0x24) < 2) {
      jsonParseReset((JsonParse *)0x2321ee);
      sqlite3DbFree((sqlite3 *)pParse,in_RDI);
    }
    else {
      *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + -1;
    }
  }
  return;
}

Assistant:

static void jsonParseFree(JsonParse *pParse){
  if( pParse ){
    if( pParse->nJPRef>1 ){
      pParse->nJPRef--;
    }else{
      jsonParseReset(pParse);
      sqlite3DbFree(pParse->db, pParse);
    }
  }
}